

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_client.c
# Opt level: O0

uo_tcp_client * uo_tcp_client_create(char *hostname,char *port)

{
  uo_tcp_client *hashtbl;
  uo_cb *puVar1;
  uo_tcp_client *tcp_client;
  char *port_local;
  char *hostname_local;
  
  hashtbl = (uo_tcp_client *)calloc(1,0x78);
  puVar1 = uo_cb_create();
  (hashtbl->evt_handlers).after_open = puVar1;
  puVar1 = uo_cb_create();
  (hashtbl->evt_handlers).before_send = puVar1;
  puVar1 = uo_cb_create();
  (hashtbl->evt_handlers).after_send = puVar1;
  puVar1 = uo_cb_create();
  (hashtbl->evt_handlers).before_recv = puVar1;
  puVar1 = uo_cb_create();
  (hashtbl->evt_handlers).after_recv = puVar1;
  puVar1 = uo_cb_create();
  (hashtbl->evt_handlers).before_close = puVar1;
  puVar1 = uo_cb_create();
  (hashtbl->evt_handlers).after_close = puVar1;
  uo_strhashtbl_create_at((uo_strhashtbl *)hashtbl,0);
  hashtbl->hostname = hostname;
  hashtbl->port = port;
  return hashtbl;
}

Assistant:

uo_tcp_client *uo_tcp_client_create(
    const char *hostname,
    const char *port)
{
    uo_tcp_client *tcp_client = calloc(1, sizeof *tcp_client);

    tcp_client->evt_handlers.after_open   = uo_cb_create();
    tcp_client->evt_handlers.before_send  = uo_cb_create();
    tcp_client->evt_handlers.after_send   = uo_cb_create();
    tcp_client->evt_handlers.before_recv  = uo_cb_create();
    tcp_client->evt_handlers.after_recv   = uo_cb_create();
    tcp_client->evt_handlers.before_close = uo_cb_create();
    tcp_client->evt_handlers.after_close  = uo_cb_create();

    uo_strhashtbl_create_at(&tcp_client->user_data, 0);

    tcp_client->hostname = hostname;
    tcp_client->port = port;

    return tcp_client;
}